

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04a.cpp
# Opt level: O0

void day4a::run(void)

{
  int iVar1;
  ostream *poVar2;
  undefined1 local_28 [8];
  string input;
  
  read_file_abi_cxx11_((string *)local_28,"input/day4.txt");
  std::operator<<((ostream *)&std::cout,"day4a ");
  iVar1 = sum_of_real_rooms((string *)local_28);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void run() {
		std::string input = read_file("input/day4.txt");
		std::cout << "day4a ";
		std::cout << sum_of_real_rooms(input) << '\n';
		//std::cout << sum_of_real_rooms("aaaaa-bbb-z-y-x-123[abxyz]\na-b-c-d-e-f-g-h-987[abcde]\nnot-a-real-room-404[oarel]\ntotally-real-room-200[decoy]") << '\n';
	}